

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O2

void anon_unknown.dwarf_8c93::GetOpenFileDescriptors
               (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *open_fds)

{
  int iVar1;
  int iVar2;
  int *y;
  Tester *this;
  int local_1ec;
  rlimit fd_rlimit;
  int local_1d4;
  Tester local_1d0;
  
  leveldb::test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix_test.cc"
             ,0x51);
  local_1ec = 0;
  local_1d4 = getrlimit(RLIMIT_NOFILE,(rlimit *)&fd_rlimit);
  leveldb::test::Tester::IsEq<int,int>(&local_1d0,&local_1ec,&local_1d4);
  leveldb::test::Tester::~Tester(&local_1d0);
  iVar1 = (int)fd_rlimit.rlim_cur;
  for (fd_rlimit.rlim_cur._0_4_ = 0; (int)fd_rlimit.rlim_cur < iVar1;
      fd_rlimit.rlim_cur._0_4_ = (int)fd_rlimit.rlim_cur + 1) {
    iVar2 = dup2((int)fd_rlimit.rlim_cur,(int)fd_rlimit.rlim_cur);
    if (iVar2 == (int)fd_rlimit.rlim_cur) {
      std::__detail::
      _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)open_fds,(value_type *)&fd_rlimit);
    }
    else {
      leveldb::test::Tester::Tester
                (&local_1d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix_test.cc"
                 ,0x62);
      local_1ec = 9;
      y = __errno_location();
      this = leveldb::test::Tester::IsEq<int,int>(&local_1d0,&local_1ec,y);
      leveldb::test::Tester::operator<<
                (this,(char (*) [60])"dup2() should set errno to EBADF on closed file descriptors");
      leveldb::test::Tester::~Tester(&local_1d0);
    }
  }
  return;
}

Assistant:

void GetOpenFileDescriptors(std::unordered_set<int>* open_fds) {
  int max_fd = 0;
  GetMaxFileDescriptor(&max_fd);

  for (int fd = 0; fd < max_fd; ++fd) {
    if (::dup2(fd, fd) != fd) {
      // When given the same file descriptor twice, dup2() returns -1 if the
      // file descriptor is closed, or the given file descriptor if it is open.
      //
      // Double-check that dup2() is saying the fd is closed.
      ASSERT_EQ(EBADF, errno)
          << "dup2() should set errno to EBADF on closed file descriptors";
      continue;
    }
    open_fds->insert(fd);
  }
}